

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void setupTransmit(char *ip)

{
  int s;
  char *buffer;
  char *ip_local;
  
  printf("IP: %s \n \n",ip);
  socket(2,2,0x11);
  memset(&server,0,0x10);
  server.sin_family = 2;
  server.sin_addr.s_addr = inet_addr(ip);
  server.sin_port = htons(0x16ad);
  std::mutex::lock(&mutex);
  setup = true;
  std::mutex::unlock(&mutex);
  return;
}

Assistant:

void setupTransmit(const char* ip) {
	printf("IP: %s \n \n", ip);	
	const char *buffer = "test UDP packet";
	int s = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP); 
	//bzero(&server, sizeof(server));	
	memset(&server, 0, sizeof(server));
	server.sin_family = AF_INET;
	server.sin_addr.s_addr = inet_addr(ip);
	server.sin_port = htons(PORT);
	mutex.lock();
	setup = true;
	mutex.unlock();
	//std::thread recvThread(recvUDP);
	//recvThread.detach();
}